

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall t_py_generator::generate_enum(t_py_generator *this,t_enum *tenum)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  char *pcVar5;
  pointer pptVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  ofstream_with_content_based_conditional_update *local_3a0;
  string local_398;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340 [32];
  ostringstream from_string_mapping;
  ostringstream to_string_mapping;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&to_string_mapping);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&from_string_mapping);
  local_3a0 = &this->f_types_;
  poVar4 = std::operator<<((ostream *)local_3a0,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"class ");
  iVar3 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
  pcVar5 = "";
  if (this->gen_newstyle_ != false) {
    pcVar5 = "(object)";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  bVar2 = this->gen_dynamic_;
  if (bVar2 == true) {
    std::operator+(&local_360,"(",&this->gen_dynbaseclass_);
    std::operator+(&local_3c0,&local_360,")");
  }
  else {
    std::__cxx11::string::string((string *)&local_3c0,"",(allocator *)&local_360);
  }
  poVar4 = std::operator<<(poVar4,(string *)&local_3c0);
  poVar4 = std::operator<<(poVar4,":");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3c0);
  if (bVar2 != false) {
    std::__cxx11::string::~string((string *)&local_360);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  generate_python_docstring(this,(ostream *)local_3a0,(t_doc *)tenum);
  t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
  poVar4 = std::operator<<(&to_string_mapping.super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&local_3c0);
  poVar4 = std::operator<<(poVar4,"_VALUES_TO_NAMES = {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3c0);
  t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
  poVar4 = std::operator<<(&from_string_mapping.super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&local_3c0);
  poVar4 = std::operator<<(poVar4,"_NAMES_TO_VALUES = {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            (&constants,&tenum->constants_);
  for (pptVar6 = constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    iVar3 = (*pptVar6)->value_;
    poVar4 = t_generator::indent(&this->super_t_generator,(ostream *)local_3a0);
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
    poVar4 = std::operator<<(&to_string_mapping.super_basic_ostream<char,_std::char_traits<char>_>,
                             (string *)&local_3c0);
    t_generator::indent_abi_cxx11_(&local_398,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_398);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,": \"");
    (*(this->super_t_generator)._vptr_t_generator[3])(local_340,this,&(*pptVar6)->name_);
    poVar4 = std::operator<<(poVar4,local_340);
    poVar4 = std::operator<<(poVar4,"\",");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_340);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3c0);
    t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
    poVar4 = std::operator<<(&from_string_mapping.super_basic_ostream<char,_std::char_traits<char>_>
                             ,(string *)&local_3c0);
    t_generator::indent_abi_cxx11_(&local_398,&this->super_t_generator);
    poVar4 = std::operator<<(poVar4,(string *)&local_398);
    poVar4 = std::operator<<(poVar4,'\"');
    (*(this->super_t_generator)._vptr_t_generator[3])(local_340,this,&(*pptVar6)->name_);
    poVar4 = std::operator<<(poVar4,local_340);
    poVar4 = std::operator<<(poVar4,"\": ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,',');
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_340);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
  poVar4 = std::operator<<(&to_string_mapping.super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&local_3c0);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3c0);
  t_generator::indent_abi_cxx11_(&local_3c0,&this->super_t_generator);
  poVar4 = std::operator<<(&from_string_mapping.super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&local_3c0);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3c0);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  std::operator<<((ostream *)local_3a0,(string *)&::endl_abi_cxx11_);
  std::__cxx11::stringbuf::str();
  poVar4 = std::operator<<((ostream *)local_3a0,(string *)&local_3c0);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::stringbuf::str();
  std::operator<<(poVar4,(string *)&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~_Vector_base
            (&constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&from_string_mapping);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&to_string_mapping);
  return;
}

Assistant:

void t_py_generator::generate_enum(t_enum* tenum) {
  std::ostringstream to_string_mapping, from_string_mapping;

  f_types_ << endl << endl << "class " << tenum->get_name() << (gen_newstyle_ ? "(object)" : "")
           << (gen_dynamic_ ? "(" + gen_dynbaseclass_ + ")" : "") << ":" << endl;
  indent_up();
  generate_python_docstring(f_types_, tenum);

  to_string_mapping << indent() << "_VALUES_TO_NAMES = {" << endl;
  from_string_mapping << indent() << "_NAMES_TO_VALUES = {" << endl;

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();
    indent(f_types_) << (*c_iter)->get_name() << " = " << value << endl;

    // Dictionaries to/from string names of enums
    to_string_mapping << indent() << indent() << value << ": \""
                      << escape_string((*c_iter)->get_name()) << "\"," << endl;
    from_string_mapping << indent() << indent() << '"' << escape_string((*c_iter)->get_name())
                        << "\": " << value << ',' << endl;
  }
  to_string_mapping << indent() << "}" << endl;
  from_string_mapping << indent() << "}" << endl;

  indent_down();
  f_types_ << endl;
  f_types_ << to_string_mapping.str() << endl << from_string_mapping.str();
}